

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  __tuple_element_t<0UL,_tuple<col_value_*,_col_value_*>_> *ppcVar5;
  __tuple_element_t<1UL,_tuple<col_value_*,_col_value_*>_> *ppcVar6;
  type piVar7;
  type plVar8;
  type prVar9;
  pointer begin;
  pointer prVar10;
  type pbVar11;
  type prVar12;
  solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
  *psVar13;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar14;
  longdouble lVar15;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar16;
  longdouble lVar17;
  bool local_1b2;
  bool local_1b1;
  bool local_1aa;
  bool local_1a9;
  type var_2;
  type var_1;
  type var;
  longdouble two;
  longdouble one;
  int local_d4;
  bool local_cd;
  int i;
  bool valid;
  int value;
  type *col_end;
  type *col_begin;
  undefined1 auStack_a8 [8];
  longdouble sum_a_p;
  type it;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> _Stack_88;
  int r_size;
  type *row_end;
  type *row_begin;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  int local_5c;
  undefined1 auStack_58 [4];
  int k;
  longdouble theta_local;
  longdouble delta_local;
  longdouble kappa_local;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *last_local;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *first_local;
  bit_array *x_local;
  solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
  *this_local;
  
  stack0xffffffffffffffc8 = kappa;
  stack0xffffffffffffffb8 = delta;
  _auStack_58 = theta;
  lVar16 = in_ST4;
  lVar17 = in_ST4;
  unique0x1000069b = last;
  last_local = first;
  first_local = (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *)x;
  x_local = (bit_array *)this;
  while( true ) {
    bVar3 = std::
            operator==<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                      (first,last);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      return false;
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::reverse_iterator(&local_68,first);
    local_5c = constraint<std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                         (&local_68);
    if (*(int *)(this + 0x80) <= local_5c) break;
    sparse_matrix<int>::row((sparse_matrix<int> *)&row_begin,(int)this + 8);
    row_end = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&row_begin);
    _Stack_88._M_head_impl =
         (col_value *)
         std::
         get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                   ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                     *)&row_begin);
    solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
    ::decrease_preference
              ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                *)this,*row_end,(row_iterator)*_Stack_88._M_head_impl,_auStack_58);
    it._4_4_ = 0;
    for (unique0x00012000 = (col_value)*row_end; stack0xffffffffffffff68 != *_Stack_88._M_head_impl;
        register0x00000000 = (col_value)((long)stack0xffffffffffffff68 + 8)) {
      _auStack_a8 = (longdouble)0;
      sparse_matrix<int>::column((sparse_matrix<int> *)&col_begin,(int)this + 8);
      ppcVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)&col_begin);
      ppcVar6 = std::
                get<1ul,baryonyx::sparse_matrix<int>::col_value*,baryonyx::sparse_matrix<int>::col_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
                            *)&col_begin);
      lVar14 = in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = lVar16;
      lVar16 = lVar17;
      while (iVar1 = it._4_4_, *ppcVar5 != *ppcVar6) {
        piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                           ((unique_ptr<int[],_std::default_delete<int[]>_> *)(this + 0x48),
                            (long)(*ppcVar5)->value);
        iVar1 = *piVar7;
        plVar8 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                            (this + 0x68),(long)(*ppcVar5)->value);
        _auStack_a8 = (longdouble)iVar1 * *plVar8 + _auStack_a8;
        *ppcVar5 = *ppcVar5 + 1;
        in_ST4 = in_ST3;
        lVar16 = in_ST3;
      }
      psVar13 = this + 0x50;
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                             *)psVar13,(long)it._4_4_);
      prVar9->id = iVar1;
      piVar7 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                         ((unique_ptr<int[],_std::default_delete<int[]>_> *)(this + 0x48),
                          (long)*(int *)stack0xffffffffffffff68);
      iVar1 = *piVar7;
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                             *)psVar13,(long)it._4_4_);
      prVar9->a = iVar1;
      quadratic_cost_type<long_double>::operator()
                (*(longdouble **)(this + 0x70),
                 (quadratic_cost_type<long_double> *)(ulong)(uint)(*row_end)->column,
                 (int)first_local,(bit_array *)prVar9);
      lVar14 = lVar14 - _auStack_a8;
      lVar17 = lVar16;
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                             *)psVar13,(long)it._4_4_);
      prVar9->value = lVar14;
      it._4_4_ = it._4_4_ + 1;
    }
    begin = std::
            unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
            ::get((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                   *)(this + 0x50));
    prVar10 = std::
              unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
              ::get((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                     *)(this + 0x50));
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*>
              (begin,prVar10 + it._4_4_,*(random_engine **)this);
    i = 0;
    pbVar11 = std::
              unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
              ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
                            *)(this + 0x58),(long)local_5c);
    local_d4 = -1;
    if (0 < pbVar11->min) {
      do {
        iVar4 = local_d4 + 1;
        psVar13 = this + 0x50;
        prVar9 = std::
                 unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                 ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                               *)psVar13,(long)iVar4);
        i = i + prVar9->a;
        pbVar11 = std::
                  unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
                  ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
                                *)(this + 0x58),(long)local_5c);
        iVar1 = pbVar11->min;
        prVar12 = *row_end;
        prVar9 = std::
                 unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                 ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                               *)psVar13,(long)iVar4);
        iVar2 = prVar9->id;
        bit_array_impl::set((bit_array_impl *)first_local,prVar12[iVar2].column);
        lVar14 = stack0xffffffffffffffb8;
        lVar15 = stack0xffffffffffffffc8 / ((longdouble)1 - stack0xffffffffffffffc8);
        prVar9 = std::
                 unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                 ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                               *)psVar13,(long)iVar4);
        lVar17 = prVar9->value;
        in_ST4 = in_ST3;
        lVar16 = in_ST3;
        plVar8 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                            (this + 0x68),(long)prVar12[iVar2].value);
        *plVar8 = *plVar8 + lVar14 + (longdouble)0.5 * lVar17 * lVar15;
        local_1a9 = i < iVar1 && local_d4 + 2 < it._4_4_;
        lVar17 = lVar16;
        local_d4 = iVar4;
      } while (local_1a9);
    }
    pbVar11 = std::
              unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
              ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
                            *)(this + 0x58),(long)local_5c);
    local_1aa = false;
    if (pbVar11->min <= i) {
      pbVar11 = std::
                unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
                              *)(this + 0x58),(long)local_5c);
      local_1aa = i <= pbVar11->max;
    }
    local_cd = local_1aa;
    while( true ) {
      local_1b1 = false;
      if (local_d4 + 1 < it._4_4_) {
        local_1b1 = local_cd;
      }
      if (local_1b1 == false) break;
      local_d4 = local_d4 + 1;
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                             *)(this + 0x50),(long)local_d4);
      i = prVar9->a + i;
      pbVar11 = std::
                unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
                              *)(this + 0x58),(long)local_5c);
      local_1b2 = false;
      if (pbVar11->min <= i) {
        pbVar11 = std::
                  unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
                  ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::bound_factor[]>_>
                                *)(this + 0x58),(long)local_5c);
        local_1b2 = i <= pbVar11->max;
      }
      local_cd = local_1b2;
      prVar12 = *row_end;
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                             *)(this + 0x50),(long)local_d4);
      prVar12 = prVar12 + prVar9->id;
      if (local_1b2 != false) {
        prVar9 = std::
                 unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                 ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                               *)(this + 0x50),(long)local_d4);
        local_cd = stop_iterating<baryonyx::itm::minimize_tag,long_double>
                             (prVar9->value,*(random_engine **)this);
      }
      if (local_cd == false) {
        bit_array_impl::unset((bit_array_impl *)first_local,prVar12->column);
        lVar14 = stack0xffffffffffffffb8;
        lVar15 = stack0xffffffffffffffc8 / ((longdouble)1 - stack0xffffffffffffffc8);
        prVar9 = std::
                 unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                 ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                               *)(this + 0x50),(long)local_d4);
        lVar17 = prVar9->value;
        in_ST4 = in_ST3;
        lVar16 = in_ST3;
        plVar8 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                            (this + 0x68),(long)prVar12->value);
        *plVar8 = *plVar8 - (lVar14 + (longdouble)0.5 * lVar17 * lVar15);
        lVar17 = lVar16;
      }
      else {
        bit_array_impl::set((bit_array_impl *)first_local,prVar12->column);
        lVar14 = stack0xffffffffffffffb8;
        lVar15 = stack0xffffffffffffffc8 / ((longdouble)1 - stack0xffffffffffffffc8);
        prVar9 = std::
                 unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                 ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                               *)(this + 0x50),(long)local_d4);
        lVar17 = prVar9->value;
        in_ST4 = in_ST3;
        lVar16 = in_ST3;
        plVar8 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                            (this + 0x68),(long)prVar12->value);
        *plVar8 = *plVar8 + lVar14 + (longdouble)0.5 * lVar17 * lVar15;
        lVar17 = lVar16;
      }
    }
    while (local_d4 + 1 < it._4_4_) {
      local_d4 = local_d4 + 1;
      prVar12 = *row_end;
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                             *)(this + 0x50),(long)local_d4);
      iVar1 = prVar9->id;
      bit_array_impl::unset((bit_array_impl *)first_local,prVar12[iVar1].column);
      lVar14 = stack0xffffffffffffffb8;
      lVar15 = stack0xffffffffffffffc8 / ((longdouble)1 - stack0xffffffffffffffc8);
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[],_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>::rc_data[]>_>
                             *)(this + 0x50),(long)local_d4);
      lVar17 = prVar9->value;
      in_ST4 = in_ST3;
      lVar16 = in_ST3;
      plVar8 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                          (this + 0x68),(long)prVar12[iVar1].value);
      *plVar8 = *plVar8 - (lVar14 + (longdouble)0.5 * lVar17 * lVar15);
      lVar17 = lVar16;
    }
    bVar3 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,baryonyx::bit_array>
                      ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                        *)this,local_5c,(bit_array *)first_local);
    if (!bVar3) {
      details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"335");
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++(first);
  }
  details::fail_fast("Precondition","k < m",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                     ,"186");
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }